

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GtestReportText.cpp
# Opt level: O0

string * __thiscall
oout::FmtText::success(string *__return_storage_ptr__,FmtText *this,string *text)

{
  ostream *poVar1;
  ostringstream local_198 [8];
  ostringstream out;
  string *text_local;
  FmtText *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,(string *)text);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar1,"[       OK ] ");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

string success(const string &text) const override
	{
		ostringstream out;
		out << text << endl << "[       OK ] ";
		return out.str();
	}